

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined4 uVar78;
  undefined4 uVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  bool bVar92;
  undefined4 uVar93;
  int iVar94;
  ulong uVar95;
  long lVar96;
  ulong uVar97;
  long lVar98;
  uint uVar99;
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  ulong *puVar103;
  ulong uVar104;
  ulong unaff_R12;
  size_t mask;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  bool bVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar112;
  float fVar120;
  float fVar121;
  vint4 bi;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  vint4 ai;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [64];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar138;
  float fVar139;
  undefined1 auVar137 [64];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  float fVar149;
  undefined1 auVar150 [32];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar151 [64];
  undefined1 auVar158 [32];
  uint uVar160;
  uint uVar161;
  uint uVar162;
  uint uVar163;
  uint uVar164;
  uint uVar165;
  uint uVar166;
  undefined1 auVar159 [64];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  float fVar169;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar170 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx::UVIdentity<8>_> hit;
  NodeRef stack [244];
  int local_bec;
  ulong local_be8;
  ulong local_be0;
  ulong local_bd8;
  ulong local_bd0;
  Scene *local_bc8;
  undefined1 local_bc0 [32];
  Geometry *local_ba0;
  ulong local_b98;
  ulong local_b90;
  ulong local_b88;
  float local_b80;
  float local_b7c;
  float local_b78;
  float local_b74;
  float local_b70;
  undefined4 local_b6c;
  uint local_b68;
  uint local_b64;
  uint local_b60;
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined4 uStack_9e4;
  undefined1 local_9e0 [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  ulong local_800;
  ulong local_7f8 [249];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar112 = ray->tfar;
    if (0.0 <= fVar112) {
      puVar103 = local_7f8;
      local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar2 = (ray->dir).field_0;
      auVar109 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar134._8_4_ = 0x7fffffff;
      auVar134._0_8_ = 0x7fffffff7fffffff;
      auVar134._12_4_ = 0x7fffffff;
      auVar134 = vandps_avx((undefined1  [16])aVar2,auVar134);
      auVar140._8_4_ = 0x219392ef;
      auVar140._0_8_ = 0x219392ef219392ef;
      auVar140._12_4_ = 0x219392ef;
      auVar134 = vcmpps_avx(auVar134,auVar140,1);
      auVar134 = vblendvps_avx((undefined1  [16])aVar2,auVar140,auVar134);
      auVar140 = vrcpps_avx(auVar134);
      fVar121 = auVar140._0_4_;
      auVar131._0_4_ = fVar121 * auVar134._0_4_;
      fVar122 = auVar140._4_4_;
      auVar131._4_4_ = fVar122 * auVar134._4_4_;
      fVar123 = auVar140._8_4_;
      auVar131._8_4_ = fVar123 * auVar134._8_4_;
      fVar124 = auVar140._12_4_;
      auVar131._12_4_ = fVar124 * auVar134._12_4_;
      auVar141._8_4_ = 0x3f800000;
      auVar141._0_8_ = &DAT_3f8000003f800000;
      auVar141._12_4_ = 0x3f800000;
      auVar134 = vsubps_avx(auVar141,auVar131);
      auVar132._0_4_ = fVar121 + fVar121 * auVar134._0_4_;
      auVar132._4_4_ = fVar122 + fVar122 * auVar134._4_4_;
      auVar132._8_4_ = fVar123 + fVar123 * auVar134._8_4_;
      auVar132._12_4_ = fVar124 + fVar124 * auVar134._12_4_;
      uVar93 = *(undefined4 *)&(ray->org).field_0;
      local_ab0._4_4_ = uVar93;
      local_ab0._0_4_ = uVar93;
      local_ab0._8_4_ = uVar93;
      local_ab0._12_4_ = uVar93;
      auVar146 = ZEXT1664(local_ab0);
      uVar93 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_ac0._4_4_ = uVar93;
      local_ac0._0_4_ = uVar93;
      local_ac0._8_4_ = uVar93;
      local_ac0._12_4_ = uVar93;
      auVar148 = ZEXT1664(local_ac0);
      uVar93 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_ad0._4_4_ = uVar93;
      local_ad0._0_4_ = uVar93;
      local_ad0._8_4_ = uVar93;
      local_ad0._12_4_ = uVar93;
      auVar151 = ZEXT1664(local_ad0);
      local_ae0 = vshufps_avx(auVar132,auVar132,0);
      auVar159 = ZEXT1664(local_ae0);
      auVar134 = vmovshdup_avx(auVar132);
      local_af0 = vshufps_avx(auVar132,auVar132,0x55);
      auVar168 = ZEXT1664(local_af0);
      auVar140 = vshufpd_avx(auVar132,auVar132,1);
      local_b00 = vshufps_avx(auVar132,auVar132,0xaa);
      auVar133 = ZEXT1664(local_b00);
      uVar104 = (ulong)(auVar132._0_4_ < 0.0) << 4;
      local_b90 = (ulong)(auVar134._0_4_ < 0.0) << 4 | 0x20;
      uVar101 = (ulong)(auVar140._0_4_ < 0.0) << 4 | 0x40;
      uVar102 = uVar104 ^ 0x10;
      uVar107 = local_b90 ^ 0x10;
      uVar97 = uVar101 ^ 0x10;
      local_b10 = vshufps_avx(auVar109,auVar109,0);
      auVar137 = ZEXT1664(local_b10);
      local_b20 = vshufps_avx(ZEXT416((uint)fVar112),ZEXT416((uint)fVar112),0);
      auVar143 = ZEXT1664(local_b20);
      local_a20._16_16_ = mm_lookupmask_ps._240_16_;
      local_a20._0_16_ = mm_lookupmask_ps._240_16_;
      local_9e0 = vperm2f128_avx(local_a20,mm_lookupmask_ps._0_32_,2);
      auVar110._8_4_ = 0xbf800000;
      auVar110._0_8_ = 0xbf800000bf800000;
      auVar110._12_4_ = 0xbf800000;
      auVar110._16_4_ = 0xbf800000;
      auVar110._20_4_ = 0xbf800000;
      auVar110._24_4_ = 0xbf800000;
      auVar110._28_4_ = 0xbf800000;
      auVar128._8_4_ = 0x3f800000;
      auVar128._0_8_ = &DAT_3f8000003f800000;
      auVar128._12_4_ = 0x3f800000;
      auVar128._16_4_ = 0x3f800000;
      auVar128._20_4_ = 0x3f800000;
      auVar128._24_4_ = 0x3f800000;
      auVar128._28_4_ = 0x3f800000;
      _local_a00 = vblendvps_avx(auVar128,auVar110,local_9e0);
      local_be8 = uVar97;
      local_be0 = uVar107;
      local_bd8 = uVar102;
      local_bd0 = uVar101;
      do {
        if (puVar103 == &local_800) {
          return;
        }
        uVar106 = puVar103[-1];
        puVar103 = puVar103 + -1;
        do {
          if ((uVar106 & 8) == 0) {
            auVar134 = vsubps_avx(*(undefined1 (*) [16])(uVar106 + 0x20 + uVar104),auVar146._0_16_);
            auVar109._0_4_ = auVar159._0_4_ * auVar134._0_4_;
            auVar109._4_4_ = auVar159._4_4_ * auVar134._4_4_;
            auVar109._8_4_ = auVar159._8_4_ * auVar134._8_4_;
            auVar109._12_4_ = auVar159._12_4_ * auVar134._12_4_;
            auVar134 = vsubps_avx(*(undefined1 (*) [16])(uVar106 + 0x20 + local_b90),auVar148._0_16_
                                 );
            auVar113._0_4_ = auVar168._0_4_ * auVar134._0_4_;
            auVar113._4_4_ = auVar168._4_4_ * auVar134._4_4_;
            auVar113._8_4_ = auVar168._8_4_ * auVar134._8_4_;
            auVar113._12_4_ = auVar168._12_4_ * auVar134._12_4_;
            auVar134 = vpmaxsd_avx(auVar109,auVar113);
            auVar109 = vsubps_avx(*(undefined1 (*) [16])(uVar106 + 0x20 + uVar101),auVar151._0_16_);
            auVar114._0_4_ = auVar133._0_4_ * auVar109._0_4_;
            auVar114._4_4_ = auVar133._4_4_ * auVar109._4_4_;
            auVar114._8_4_ = auVar133._8_4_ * auVar109._8_4_;
            auVar114._12_4_ = auVar133._12_4_ * auVar109._12_4_;
            auVar109 = vpmaxsd_avx(auVar114,auVar137._0_16_);
            auVar134 = vpmaxsd_avx(auVar134,auVar109);
            auVar109 = vsubps_avx(*(undefined1 (*) [16])(uVar106 + 0x20 + uVar102),auVar146._0_16_);
            auVar115._0_4_ = auVar159._0_4_ * auVar109._0_4_;
            auVar115._4_4_ = auVar159._4_4_ * auVar109._4_4_;
            auVar115._8_4_ = auVar159._8_4_ * auVar109._8_4_;
            auVar115._12_4_ = auVar159._12_4_ * auVar109._12_4_;
            auVar109 = vsubps_avx(*(undefined1 (*) [16])(uVar106 + 0x20 + uVar107),auVar148._0_16_);
            auVar126._0_4_ = auVar168._0_4_ * auVar109._0_4_;
            auVar126._4_4_ = auVar168._4_4_ * auVar109._4_4_;
            auVar126._8_4_ = auVar168._8_4_ * auVar109._8_4_;
            auVar126._12_4_ = auVar168._12_4_ * auVar109._12_4_;
            auVar109 = vpminsd_avx(auVar115,auVar126);
            auVar140 = vsubps_avx(*(undefined1 (*) [16])(uVar106 + 0x20 + uVar97),auVar151._0_16_);
            auVar127._0_4_ = auVar133._0_4_ * auVar140._0_4_;
            auVar127._4_4_ = auVar133._4_4_ * auVar140._4_4_;
            auVar127._8_4_ = auVar133._8_4_ * auVar140._8_4_;
            auVar127._12_4_ = auVar133._12_4_ * auVar140._12_4_;
            auVar140 = vpminsd_avx(auVar127,auVar143._0_16_);
            auVar109 = vpminsd_avx(auVar109,auVar140);
            auVar134 = vpcmpgtd_avx(auVar134,auVar109);
            uVar93 = vmovmskps_avx(auVar134);
            unaff_R12 = (ulong)(byte)((byte)uVar93 ^ 0xf);
          }
          if ((uVar106 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar94 = 4;
            }
            else {
              uVar105 = uVar106 & 0xfffffffffffffff0;
              lVar98 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
                }
              }
              uVar106 = *(ulong *)(uVar105 + lVar98 * 8);
              uVar100 = unaff_R12 - 1 & unaff_R12;
              if (uVar100 != 0) {
                *puVar103 = uVar106;
                lVar98 = 0;
                if (uVar100 != 0) {
                  for (; (uVar100 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
                  }
                }
                uVar95 = uVar100 - 1;
                while( true ) {
                  puVar103 = puVar103 + 1;
                  uVar106 = *(ulong *)(uVar105 + lVar98 * 8);
                  uVar95 = uVar95 & uVar100;
                  if (uVar95 == 0) break;
                  *puVar103 = uVar106;
                  lVar98 = 0;
                  if (uVar95 != 0) {
                    for (; (uVar95 >> lVar98 & 1) == 0; lVar98 = lVar98 + 1) {
                    }
                  }
                  uVar100 = uVar95 - 1;
                }
              }
              iVar94 = 0;
            }
          }
          else {
            iVar94 = 6;
          }
        } while (iVar94 == 0);
        if (iVar94 == 6) {
          iVar94 = 0;
          local_b88 = (ulong)((uint)uVar106 & 0xf) - 8;
          bVar108 = local_b88 != 0;
          if (bVar108) {
            uVar106 = uVar106 & 0xfffffffffffffff0;
            local_bc8 = context->scene;
            uVar97 = 0;
            do {
              lVar96 = uVar97 * 0x60;
              ppfVar3 = (local_bc8->vertices).items;
              pfVar4 = ppfVar3[*(uint *)(uVar106 + 0x40 + lVar96)];
              pfVar5 = ppfVar3[*(uint *)(uVar106 + 0x44 + lVar96)];
              pfVar6 = ppfVar3[*(uint *)(uVar106 + 0x48 + lVar96)];
              pfVar7 = ppfVar3[*(uint *)(uVar106 + 0x4c + lVar96)];
              auVar140 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar106 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar106 + 8 + lVar96)));
              auVar134 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar106 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar106 + 8 + lVar96)));
              auVar131 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar106 + 4 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar106 + 0xc + lVar96)));
              auVar109 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar106 + 4 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar106 + 0xc + lVar96)));
              auVar141 = vunpcklps_avx(auVar134,auVar109);
              auVar113 = vunpcklps_avx(auVar140,auVar131);
              auVar134 = vunpckhps_avx(auVar140,auVar131);
              auVar131 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar4 + *(uint *)(uVar106 + 0x10 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar106 + 0x18 + lVar96)));
              auVar109 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar4 + *(uint *)(uVar106 + 0x10 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar106 + 0x18 + lVar96)));
              auVar132 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar106 + 0x14 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar106 + 0x1c + lVar96)));
              auVar140 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar106 + 0x14 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar106 + 0x1c + lVar96)));
              auVar114 = vunpcklps_avx(auVar109,auVar140);
              auVar115 = vunpcklps_avx(auVar131,auVar132);
              auVar109 = vunpckhps_avx(auVar131,auVar132);
              auVar132 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar4 + *(uint *)(uVar106 + 0x20 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar106 + 0x28 + lVar96)));
              auVar140 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar4 + *(uint *)(uVar106 + 0x20 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar106 + 0x28 + lVar96)));
              auVar126 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar106 + 0x24 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar106 + 0x2c + lVar96)));
              auVar131 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar106 + 0x24 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar106 + 0x2c + lVar96)));
              auVar127 = vunpcklps_avx(auVar140,auVar131);
              auVar75 = vunpcklps_avx(auVar132,auVar126);
              auVar140 = vunpckhps_avx(auVar132,auVar126);
              auVar126 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar4 + *(uint *)(uVar106 + 0x30 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar106 + 0x38 + lVar96)));
              auVar131 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar4 + *(uint *)(uVar106 + 0x30 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar6 + *(uint *)(uVar106 + 0x38 + lVar96)));
              auVar76 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar5 + *(uint *)(uVar106 + 0x34 + lVar96)),
                                      *(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar106 + 0x3c + lVar96)));
              auVar132 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar5 + *(uint *)(uVar106 + 0x34 + lVar96)),
                                       *(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar106 + 0x3c + lVar96)));
              auVar132 = vunpcklps_avx(auVar131,auVar132);
              auVar77 = vunpcklps_avx(auVar126,auVar76);
              auVar131 = vunpckhps_avx(auVar126,auVar76);
              lVar98 = uVar106 + 0x40 + lVar96;
              local_9a0 = *(undefined8 *)(lVar98 + 0x10);
              uStack_998 = *(undefined8 *)(lVar98 + 0x18);
              uStack_990 = local_9a0;
              uStack_988 = uStack_998;
              lVar96 = uVar106 + 0x50 + lVar96;
              local_9c0 = *(undefined8 *)(lVar96 + 0x10);
              uStack_9b8 = *(undefined8 *)(lVar96 + 0x18);
              uStack_9b0 = local_9c0;
              uStack_9a8 = uStack_9b8;
              auVar135._16_16_ = auVar75;
              auVar135._0_16_ = auVar113;
              auVar142._16_16_ = auVar140;
              auVar142._0_16_ = auVar134;
              auVar147._16_16_ = auVar127;
              auVar147._0_16_ = auVar141;
              auVar116._16_16_ = auVar115;
              auVar116._0_16_ = auVar115;
              auVar144._16_16_ = auVar109;
              auVar144._0_16_ = auVar109;
              auVar129._16_16_ = auVar114;
              auVar129._0_16_ = auVar114;
              auVar158._16_16_ = auVar77;
              auVar158._0_16_ = auVar77;
              auVar167._16_16_ = auVar131;
              auVar167._0_16_ = auVar131;
              auVar111._16_16_ = auVar132;
              auVar111._0_16_ = auVar132;
              local_bc0 = vsubps_avx(auVar135,auVar116);
              local_a80 = vsubps_avx(auVar142,auVar144);
              auVar110 = vsubps_avx(auVar147,auVar129);
              auVar128 = vsubps_avx(auVar158,auVar135);
              auVar116 = vsubps_avx(auVar167,auVar142);
              auVar111 = vsubps_avx(auVar111,auVar147);
              fVar123 = auVar111._0_4_;
              fVar169 = local_a80._0_4_;
              fVar12 = auVar111._4_4_;
              fVar171 = local_a80._4_4_;
              auVar72._4_4_ = fVar171 * fVar12;
              auVar72._0_4_ = fVar169 * fVar123;
              fVar22 = auVar111._8_4_;
              fVar172 = local_a80._8_4_;
              auVar72._8_4_ = fVar172 * fVar22;
              fVar32 = auVar111._12_4_;
              fVar173 = local_a80._12_4_;
              auVar72._12_4_ = fVar173 * fVar32;
              fVar42 = auVar111._16_4_;
              fVar174 = local_a80._16_4_;
              auVar72._16_4_ = fVar174 * fVar42;
              fVar52 = auVar111._20_4_;
              fVar175 = local_a80._20_4_;
              auVar72._20_4_ = fVar175 * fVar52;
              fVar62 = auVar111._24_4_;
              fVar176 = local_a80._24_4_;
              auVar72._24_4_ = fVar176 * fVar62;
              auVar72._28_4_ = auVar132._12_4_;
              fVar124 = auVar116._0_4_;
              fVar149 = auVar110._0_4_;
              fVar13 = auVar116._4_4_;
              fVar152 = auVar110._4_4_;
              auVar73._4_4_ = fVar152 * fVar13;
              auVar73._0_4_ = fVar149 * fVar124;
              fVar23 = auVar116._8_4_;
              fVar153 = auVar110._8_4_;
              auVar73._8_4_ = fVar153 * fVar23;
              fVar33 = auVar116._12_4_;
              fVar154 = auVar110._12_4_;
              auVar73._12_4_ = fVar154 * fVar33;
              fVar43 = auVar116._16_4_;
              fVar155 = auVar110._16_4_;
              auVar73._16_4_ = fVar155 * fVar43;
              fVar53 = auVar116._20_4_;
              fVar156 = auVar110._20_4_;
              auVar73._20_4_ = fVar156 * fVar53;
              fVar63 = auVar116._24_4_;
              uVar78 = auVar115._12_4_;
              fVar157 = auVar110._24_4_;
              auVar73._24_4_ = fVar157 * fVar63;
              auVar73._28_4_ = uVar78;
              local_a40 = vsubps_avx(auVar73,auVar72);
              fVar125 = auVar128._0_4_;
              fVar14 = auVar128._4_4_;
              auVar74._4_4_ = fVar152 * fVar14;
              auVar74._0_4_ = fVar149 * fVar125;
              fVar24 = auVar128._8_4_;
              auVar74._8_4_ = fVar153 * fVar24;
              fVar34 = auVar128._12_4_;
              auVar74._12_4_ = fVar154 * fVar34;
              fVar44 = auVar128._16_4_;
              auVar74._16_4_ = fVar155 * fVar44;
              fVar54 = auVar128._20_4_;
              auVar74._20_4_ = fVar156 * fVar54;
              fVar64 = auVar128._24_4_;
              uVar79 = local_a40._28_4_;
              auVar74._24_4_ = fVar157 * fVar64;
              auVar74._28_4_ = uVar79;
              fVar138 = local_bc0._0_4_;
              fVar15 = local_bc0._4_4_;
              auVar80._4_4_ = fVar12 * fVar15;
              auVar80._0_4_ = fVar123 * fVar138;
              fVar25 = local_bc0._8_4_;
              auVar80._8_4_ = fVar22 * fVar25;
              fVar35 = local_bc0._12_4_;
              auVar80._12_4_ = fVar32 * fVar35;
              fVar45 = local_bc0._16_4_;
              auVar80._16_4_ = fVar42 * fVar45;
              fVar55 = local_bc0._20_4_;
              auVar80._20_4_ = fVar52 * fVar55;
              fVar65 = local_bc0._24_4_;
              auVar80._24_4_ = fVar62 * fVar65;
              auVar80._28_4_ = auVar114._12_4_;
              auVar110 = vsubps_avx(auVar80,auVar74);
              auVar81._4_4_ = fVar13 * fVar15;
              auVar81._0_4_ = fVar124 * fVar138;
              auVar81._8_4_ = fVar23 * fVar25;
              auVar81._12_4_ = fVar33 * fVar35;
              auVar81._16_4_ = fVar43 * fVar45;
              auVar81._20_4_ = fVar53 * fVar55;
              auVar81._24_4_ = fVar63 * fVar65;
              auVar81._28_4_ = uVar79;
              auVar82._4_4_ = fVar171 * fVar14;
              auVar82._0_4_ = fVar169 * fVar125;
              auVar82._8_4_ = fVar172 * fVar24;
              auVar82._12_4_ = fVar173 * fVar34;
              auVar82._16_4_ = fVar174 * fVar44;
              auVar82._20_4_ = fVar175 * fVar54;
              auVar82._24_4_ = fVar176 * fVar64;
              auVar82._28_4_ = local_a80._28_4_;
              local_aa0 = vsubps_avx(auVar82,auVar81);
              uVar93 = *(undefined4 *)&(ray->org).field_0;
              auVar170._4_4_ = uVar93;
              auVar170._0_4_ = uVar93;
              auVar170._8_4_ = uVar93;
              auVar170._12_4_ = uVar93;
              auVar170._16_4_ = uVar93;
              auVar170._20_4_ = uVar93;
              auVar170._24_4_ = uVar93;
              auVar170._28_4_ = uVar93;
              uVar93 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar177._4_4_ = uVar93;
              auVar177._0_4_ = uVar93;
              auVar177._8_4_ = uVar93;
              auVar177._12_4_ = uVar93;
              auVar177._16_4_ = uVar93;
              auVar177._20_4_ = uVar93;
              auVar177._24_4_ = uVar93;
              auVar177._28_4_ = uVar93;
              uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar178._4_4_ = uVar1;
              auVar178._0_4_ = uVar1;
              auVar178._8_4_ = uVar1;
              auVar178._12_4_ = uVar1;
              auVar178._16_4_ = uVar1;
              auVar178._20_4_ = uVar1;
              auVar178._24_4_ = uVar1;
              auVar178._28_4_ = uVar1;
              fVar112 = (ray->dir).field_0.m128[1];
              local_a60 = vsubps_avx(auVar135,auVar170);
              fVar121 = (ray->dir).field_0.m128[2];
              auVar72 = vsubps_avx(auVar142,auVar177);
              auVar73 = vsubps_avx(auVar147,auVar178);
              fVar139 = auVar73._0_4_;
              fVar16 = auVar73._4_4_;
              auVar83._4_4_ = fVar112 * fVar16;
              auVar83._0_4_ = fVar112 * fVar139;
              fVar26 = auVar73._8_4_;
              auVar83._8_4_ = fVar112 * fVar26;
              fVar36 = auVar73._12_4_;
              auVar83._12_4_ = fVar112 * fVar36;
              fVar46 = auVar73._16_4_;
              auVar83._16_4_ = fVar112 * fVar46;
              fVar56 = auVar73._20_4_;
              auVar83._20_4_ = fVar112 * fVar56;
              fVar66 = auVar73._24_4_;
              auVar83._24_4_ = fVar112 * fVar66;
              auVar83._28_4_ = uVar93;
              fVar120 = auVar72._0_4_;
              fVar17 = auVar72._4_4_;
              auVar84._4_4_ = fVar121 * fVar17;
              auVar84._0_4_ = fVar121 * fVar120;
              fVar27 = auVar72._8_4_;
              auVar84._8_4_ = fVar121 * fVar27;
              fVar37 = auVar72._12_4_;
              auVar84._12_4_ = fVar121 * fVar37;
              fVar47 = auVar72._16_4_;
              auVar84._16_4_ = fVar121 * fVar47;
              fVar57 = auVar72._20_4_;
              auVar84._20_4_ = fVar121 * fVar57;
              fVar67 = auVar72._24_4_;
              auVar84._24_4_ = fVar121 * fVar67;
              auVar84._28_4_ = uVar1;
              auVar72 = vsubps_avx(auVar84,auVar83);
              fVar122 = (ray->dir).field_0.m128[0];
              fVar8 = local_a60._0_4_;
              fVar18 = local_a60._4_4_;
              auVar85._4_4_ = fVar121 * fVar18;
              auVar85._0_4_ = fVar121 * fVar8;
              fVar28 = local_a60._8_4_;
              auVar85._8_4_ = fVar121 * fVar28;
              fVar38 = local_a60._12_4_;
              auVar85._12_4_ = fVar121 * fVar38;
              fVar48 = local_a60._16_4_;
              auVar85._16_4_ = fVar121 * fVar48;
              fVar58 = local_a60._20_4_;
              auVar85._20_4_ = fVar121 * fVar58;
              fVar68 = local_a60._24_4_;
              auVar85._24_4_ = fVar121 * fVar68;
              auVar85._28_4_ = uVar79;
              auVar86._4_4_ = fVar122 * fVar16;
              auVar86._0_4_ = fVar122 * fVar139;
              auVar86._8_4_ = fVar122 * fVar26;
              auVar86._12_4_ = fVar122 * fVar36;
              auVar86._16_4_ = fVar122 * fVar46;
              auVar86._20_4_ = fVar122 * fVar56;
              auVar86._24_4_ = fVar122 * fVar66;
              auVar86._28_4_ = uVar78;
              auVar73 = vsubps_avx(auVar86,auVar85);
              auVar87._4_4_ = fVar122 * fVar17;
              auVar87._0_4_ = fVar122 * fVar120;
              auVar87._8_4_ = fVar122 * fVar27;
              auVar87._12_4_ = fVar122 * fVar37;
              auVar87._16_4_ = fVar122 * fVar47;
              auVar87._20_4_ = fVar122 * fVar57;
              auVar87._24_4_ = fVar122 * fVar67;
              auVar87._28_4_ = uVar78;
              auVar88._4_4_ = fVar112 * fVar18;
              auVar88._0_4_ = fVar112 * fVar8;
              auVar88._8_4_ = fVar112 * fVar28;
              auVar88._12_4_ = fVar112 * fVar38;
              auVar88._16_4_ = fVar112 * fVar48;
              auVar88._20_4_ = fVar112 * fVar58;
              auVar88._24_4_ = fVar112 * fVar68;
              auVar88._28_4_ = local_a60._28_4_;
              auVar74 = vsubps_avx(auVar88,auVar87);
              fVar9 = local_aa0._0_4_;
              fVar19 = local_aa0._4_4_;
              fVar29 = local_aa0._8_4_;
              fVar39 = local_aa0._12_4_;
              fVar49 = local_aa0._16_4_;
              fVar59 = local_aa0._20_4_;
              fVar69 = local_aa0._24_4_;
              fVar10 = auVar110._0_4_;
              fVar20 = auVar110._4_4_;
              fVar30 = auVar110._8_4_;
              fVar40 = auVar110._12_4_;
              fVar50 = auVar110._16_4_;
              fVar60 = auVar110._20_4_;
              fVar70 = auVar110._24_4_;
              fVar11 = local_a40._0_4_;
              fVar21 = local_a40._4_4_;
              fVar31 = local_a40._8_4_;
              fVar41 = local_a40._12_4_;
              fVar51 = local_a40._16_4_;
              fVar61 = local_a40._20_4_;
              fVar71 = local_a40._24_4_;
              auVar130._0_4_ = fVar122 * fVar11 + fVar112 * fVar10 + fVar121 * fVar9;
              auVar130._4_4_ = fVar122 * fVar21 + fVar112 * fVar20 + fVar121 * fVar19;
              auVar130._8_4_ = fVar122 * fVar31 + fVar112 * fVar30 + fVar121 * fVar29;
              auVar130._12_4_ = fVar122 * fVar41 + fVar112 * fVar40 + fVar121 * fVar39;
              auVar130._16_4_ = fVar122 * fVar51 + fVar112 * fVar50 + fVar121 * fVar49;
              auVar130._20_4_ = fVar122 * fVar61 + fVar112 * fVar60 + fVar121 * fVar59;
              auVar130._24_4_ = fVar122 * fVar71 + fVar112 * fVar70 + fVar121 * fVar69;
              auVar130._28_4_ = fVar121 + fVar121 + local_a60._28_4_;
              auVar117._8_4_ = 0x80000000;
              auVar117._0_8_ = 0x8000000080000000;
              auVar117._12_4_ = 0x80000000;
              auVar117._16_4_ = 0x80000000;
              auVar117._20_4_ = 0x80000000;
              auVar117._24_4_ = 0x80000000;
              auVar117._28_4_ = 0x80000000;
              auVar110 = vandps_avx(auVar130,auVar117);
              uVar99 = auVar110._0_4_;
              auVar145._0_4_ =
                   (float)(uVar99 ^ (uint)(fVar125 * auVar72._0_4_ +
                                          fVar124 * auVar73._0_4_ + fVar123 * auVar74._0_4_));
              uVar160 = auVar110._4_4_;
              auVar145._4_4_ =
                   (float)(uVar160 ^
                          (uint)(fVar14 * auVar72._4_4_ +
                                fVar13 * auVar73._4_4_ + fVar12 * auVar74._4_4_));
              uVar161 = auVar110._8_4_;
              auVar145._8_4_ =
                   (float)(uVar161 ^
                          (uint)(fVar24 * auVar72._8_4_ +
                                fVar23 * auVar73._8_4_ + fVar22 * auVar74._8_4_));
              uVar162 = auVar110._12_4_;
              auVar145._12_4_ =
                   (float)(uVar162 ^
                          (uint)(fVar34 * auVar72._12_4_ +
                                fVar33 * auVar73._12_4_ + fVar32 * auVar74._12_4_));
              uVar163 = auVar110._16_4_;
              auVar145._16_4_ =
                   (float)(uVar163 ^
                          (uint)(fVar44 * auVar72._16_4_ +
                                fVar43 * auVar73._16_4_ + fVar42 * auVar74._16_4_));
              uVar164 = auVar110._20_4_;
              auVar145._20_4_ =
                   (float)(uVar164 ^
                          (uint)(fVar54 * auVar72._20_4_ +
                                fVar53 * auVar73._20_4_ + fVar52 * auVar74._20_4_));
              uVar165 = auVar110._24_4_;
              auVar145._24_4_ =
                   (float)(uVar165 ^
                          (uint)(fVar64 * auVar72._24_4_ +
                                fVar63 * auVar73._24_4_ + fVar62 * auVar74._24_4_));
              uVar166 = auVar110._28_4_;
              auVar145._28_4_ =
                   (float)(uVar166 ^ (uint)(auVar128._28_4_ + auVar116._28_4_ + auVar111._28_4_));
              auVar150._0_4_ =
                   (float)(uVar99 ^ (uint)(auVar72._0_4_ * fVar138 +
                                          auVar73._0_4_ * fVar169 + fVar149 * auVar74._0_4_));
              auVar150._4_4_ =
                   (float)(uVar160 ^
                          (uint)(auVar72._4_4_ * fVar15 +
                                auVar73._4_4_ * fVar171 + fVar152 * auVar74._4_4_));
              auVar150._8_4_ =
                   (float)(uVar161 ^
                          (uint)(auVar72._8_4_ * fVar25 +
                                auVar73._8_4_ * fVar172 + fVar153 * auVar74._8_4_));
              auVar150._12_4_ =
                   (float)(uVar162 ^
                          (uint)(auVar72._12_4_ * fVar35 +
                                auVar73._12_4_ * fVar173 + fVar154 * auVar74._12_4_));
              auVar150._16_4_ =
                   (float)(uVar163 ^
                          (uint)(auVar72._16_4_ * fVar45 +
                                auVar73._16_4_ * fVar174 + fVar155 * auVar74._16_4_));
              auVar150._20_4_ =
                   (float)(uVar164 ^
                          (uint)(auVar72._20_4_ * fVar55 +
                                auVar73._20_4_ * fVar175 + fVar156 * auVar74._20_4_));
              auVar150._24_4_ =
                   (float)(uVar165 ^
                          (uint)(auVar72._24_4_ * fVar65 +
                                auVar73._24_4_ * fVar176 + fVar157 * auVar74._24_4_));
              auVar150._28_4_ = (float)(uVar166 ^ (uint)(auVar73._28_4_ + auVar74._28_4_ + -0.0));
              auVar128 = ZEXT1232(ZEXT412(0)) << 0x20;
              auVar110 = vcmpps_avx(auVar145,auVar128,5);
              auVar128 = vcmpps_avx(auVar150,auVar128,5);
              auVar110 = vandps_avx(auVar110,auVar128);
              auVar118._8_4_ = 0x7fffffff;
              auVar118._0_8_ = 0x7fffffff7fffffff;
              auVar118._12_4_ = 0x7fffffff;
              auVar118._16_4_ = 0x7fffffff;
              auVar118._20_4_ = 0x7fffffff;
              auVar118._24_4_ = 0x7fffffff;
              auVar118._28_4_ = 0x7fffffff;
              local_920 = vandps_avx(auVar130,auVar118);
              auVar128 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar130,4);
              auVar110 = vandps_avx(auVar110,auVar128);
              auVar119._0_4_ = auVar150._0_4_ + auVar145._0_4_;
              auVar119._4_4_ = auVar150._4_4_ + auVar145._4_4_;
              auVar119._8_4_ = auVar150._8_4_ + auVar145._8_4_;
              auVar119._12_4_ = auVar150._12_4_ + auVar145._12_4_;
              auVar119._16_4_ = auVar150._16_4_ + auVar145._16_4_;
              auVar119._20_4_ = auVar150._20_4_ + auVar145._20_4_;
              auVar119._24_4_ = auVar150._24_4_ + auVar145._24_4_;
              auVar119._28_4_ = auVar150._28_4_ + auVar145._28_4_;
              auVar116 = vcmpps_avx(auVar119,local_920,2);
              auVar128 = vandps_avx(auVar110,auVar116);
              auVar111 = local_a20 & auVar128;
              if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar111 >> 0x7f,0) != '\0') ||
                    (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar111 >> 0xbf,0) != '\0') ||
                  (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar111[0x1f] < '\0') {
                auVar128 = vandps_avx(auVar128,local_a20);
                local_940._0_4_ =
                     (float)(uVar99 ^ (uint)(fVar11 * fVar8 + fVar10 * fVar120 + fVar139 * fVar9));
                local_940._4_4_ =
                     (float)(uVar160 ^ (uint)(fVar21 * fVar18 + fVar20 * fVar17 + fVar16 * fVar19));
                local_940._8_4_ =
                     (float)(uVar161 ^ (uint)(fVar31 * fVar28 + fVar30 * fVar27 + fVar26 * fVar29));
                local_940._12_4_ =
                     (float)(uVar162 ^ (uint)(fVar41 * fVar38 + fVar40 * fVar37 + fVar36 * fVar39));
                local_940._16_4_ =
                     (float)(uVar163 ^ (uint)(fVar51 * fVar48 + fVar50 * fVar47 + fVar46 * fVar49));
                local_940._20_4_ =
                     (float)(uVar164 ^ (uint)(fVar61 * fVar58 + fVar60 * fVar57 + fVar56 * fVar59));
                local_940._24_4_ =
                     (float)(uVar165 ^ (uint)(fVar71 * fVar68 + fVar70 * fVar67 + fVar66 * fVar69));
                local_940._28_4_ =
                     uVar166 ^ (uint)(auVar116._28_4_ + auVar116._28_4_ + auVar110._28_4_);
                fVar112 = (ray->org).field_0.m128[3];
                fVar121 = local_920._0_4_;
                fVar122 = local_920._4_4_;
                auVar89._4_4_ = fVar122 * fVar112;
                auVar89._0_4_ = fVar121 * fVar112;
                fVar123 = local_920._8_4_;
                auVar89._8_4_ = fVar123 * fVar112;
                fVar124 = local_920._12_4_;
                auVar89._12_4_ = fVar124 * fVar112;
                fVar125 = local_920._16_4_;
                auVar89._16_4_ = fVar125 * fVar112;
                fVar138 = local_920._20_4_;
                auVar89._20_4_ = fVar138 * fVar112;
                fVar139 = local_920._24_4_;
                auVar89._24_4_ = fVar139 * fVar112;
                auVar89._28_4_ = fVar112;
                auVar110 = vcmpps_avx(auVar89,local_940,1);
                fVar112 = ray->tfar;
                auVar90._4_4_ = fVar122 * fVar112;
                auVar90._0_4_ = fVar121 * fVar112;
                auVar90._8_4_ = fVar123 * fVar112;
                auVar90._12_4_ = fVar124 * fVar112;
                auVar90._16_4_ = fVar125 * fVar112;
                auVar90._20_4_ = fVar138 * fVar112;
                auVar90._24_4_ = fVar139 * fVar112;
                auVar90._28_4_ = fVar112;
                auVar116 = vcmpps_avx(local_940,auVar90,2);
                auVar110 = vandps_avx(auVar116,auVar110);
                auVar116 = auVar128 & auVar110;
                if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar116 >> 0x7f,0) != '\0') ||
                      (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar116 >> 0xbf,0) != '\0') ||
                    (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar116[0x1f] < '\0') {
                  local_8e0 = vandps_avx(auVar128,auVar110);
                  auVar110 = vsubps_avx(local_920,auVar150);
                  local_980 = vblendvps_avx(auVar145,auVar110,local_9e0);
                  auVar110 = vsubps_avx(local_920,auVar145);
                  local_960 = vblendvps_avx(auVar150,auVar110,local_9e0);
                  local_860[0] = fVar11 * (float)local_a00._0_4_;
                  local_860[1] = fVar21 * (float)local_a00._4_4_;
                  local_860[2] = fVar31 * fStack_9f8;
                  local_860[3] = fVar41 * fStack_9f4;
                  fStack_850 = fVar51 * fStack_9f0;
                  fStack_84c = fVar61 * fStack_9ec;
                  fStack_848 = fVar71 * fStack_9e8;
                  fStack_844 = auVar150._28_4_;
                  local_840[0] = fVar10 * (float)local_a00._0_4_;
                  local_840[1] = fVar20 * (float)local_a00._4_4_;
                  local_840[2] = fVar30 * fStack_9f8;
                  local_840[3] = fVar40 * fStack_9f4;
                  fStack_830 = fVar50 * fStack_9f0;
                  fStack_82c = fVar60 * fStack_9ec;
                  fStack_828 = fVar70 * fStack_9e8;
                  fStack_824 = auVar150._28_4_;
                  auVar110 = vrcpps_avx(local_920);
                  local_820[0] = (float)local_a00._0_4_ * fVar9;
                  local_820[1] = (float)local_a00._4_4_ * fVar19;
                  local_820[2] = fStack_9f8 * fVar29;
                  local_820[3] = fStack_9f4 * fVar39;
                  fStack_810 = fStack_9f0 * fVar49;
                  fStack_80c = fStack_9ec * fVar59;
                  fStack_808 = fStack_9e8 * fVar69;
                  uStack_804 = uStack_9e4;
                  fVar112 = auVar110._0_4_;
                  fVar120 = auVar110._4_4_;
                  auVar91._4_4_ = fVar122 * fVar120;
                  auVar91._0_4_ = fVar121 * fVar112;
                  fVar121 = auVar110._8_4_;
                  auVar91._8_4_ = fVar123 * fVar121;
                  fVar122 = auVar110._12_4_;
                  auVar91._12_4_ = fVar124 * fVar122;
                  fVar123 = auVar110._16_4_;
                  auVar91._16_4_ = fVar125 * fVar123;
                  fVar124 = auVar110._20_4_;
                  auVar91._20_4_ = fVar138 * fVar124;
                  fVar125 = auVar110._24_4_;
                  auVar91._24_4_ = fVar139 * fVar125;
                  auVar91._28_4_ = uStack_9e4;
                  auVar136._8_4_ = 0x3f800000;
                  auVar136._0_8_ = &DAT_3f8000003f800000;
                  auVar136._12_4_ = 0x3f800000;
                  auVar136._16_4_ = 0x3f800000;
                  auVar136._20_4_ = 0x3f800000;
                  auVar136._24_4_ = 0x3f800000;
                  auVar136._28_4_ = 0x3f800000;
                  auVar110 = vsubps_avx(auVar136,auVar91);
                  fVar112 = fVar112 + fVar112 * auVar110._0_4_;
                  fVar120 = fVar120 + fVar120 * auVar110._4_4_;
                  fVar121 = fVar121 + fVar121 * auVar110._8_4_;
                  fVar122 = fVar122 + fVar122 * auVar110._12_4_;
                  fVar123 = fVar123 + fVar123 * auVar110._16_4_;
                  fVar124 = fVar124 + fVar124 * auVar110._20_4_;
                  fVar125 = fVar125 + fVar125 * auVar110._24_4_;
                  local_880._4_4_ = fVar120 * local_940._4_4_;
                  local_880._0_4_ = fVar112 * local_940._0_4_;
                  local_880._8_4_ = fVar121 * local_940._8_4_;
                  local_880._12_4_ = fVar122 * local_940._12_4_;
                  local_880._16_4_ = fVar123 * local_940._16_4_;
                  local_880._20_4_ = fVar124 * local_940._20_4_;
                  local_880._24_4_ = fVar125 * local_940._24_4_;
                  local_880._28_4_ = auVar110._28_4_;
                  local_8c0._4_4_ = local_980._4_4_ * fVar120;
                  local_8c0._0_4_ = local_980._0_4_ * fVar112;
                  local_8c0._8_4_ = local_980._8_4_ * fVar121;
                  local_8c0._12_4_ = local_980._12_4_ * fVar122;
                  local_8c0._16_4_ = local_980._16_4_ * fVar123;
                  local_8c0._20_4_ = local_980._20_4_ * fVar124;
                  local_8c0._24_4_ = local_980._24_4_ * fVar125;
                  local_8c0._28_4_ = local_980._28_4_;
                  local_8a0[0] = local_960._0_4_ * fVar112;
                  local_8a0[1] = local_960._4_4_ * fVar120;
                  local_8a0[2] = local_960._8_4_ * fVar121;
                  local_8a0[3] = local_960._12_4_ * fVar122;
                  fStack_890 = local_960._16_4_ * fVar123;
                  fStack_88c = local_960._20_4_ * fVar124;
                  fStack_888 = local_960._24_4_ * fVar125;
                  uStack_884 = local_960._28_4_;
                  uVar99 = vmovmskps_avx(local_8e0);
                  uVar101 = (ulong)uVar99;
                  do {
                    local_b98 = 0;
                    if (uVar101 != 0) {
                      for (; (uVar101 >> local_b98 & 1) == 0; local_b98 = local_b98 + 1) {
                      }
                    }
                    local_b68 = *(uint *)((long)&local_9a0 + local_b98 * 4);
                    local_ba0 = (local_bc8->geometries).items[local_b68].ptr;
                    if ((local_ba0->mask & ray->mask) == 0) {
                      uVar101 = uVar101 ^ 1L << (local_b98 & 0x3f);
                      bVar92 = true;
                    }
                    else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                            (local_ba0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar92 = false;
                    }
                    else {
                      local_a80._0_8_ = context->args;
                      local_bc0._0_8_ = uVar101;
                      local_a60._0_8_ = uVar104;
                      local_aa0._0_8_ = puVar103;
                      local_b74 = local_8a0[local_b98 - 8];
                      local_b70 = local_8a0[local_b98];
                      local_a40._0_8_ = context;
                      local_b50.context = context->user;
                      local_b6c = *(undefined4 *)((long)&local_9c0 + local_b98 * 4);
                      local_b80 = local_860[local_b98];
                      local_b7c = local_840[local_b98];
                      local_b78 = local_820[local_b98];
                      local_b64 = (local_b50.context)->instID[0];
                      local_b60 = (local_b50.context)->instPrimID[0];
                      fVar112 = ray->tfar;
                      ray->tfar = local_860[local_b98 - 8];
                      local_bec = -1;
                      local_b50.valid = &local_bec;
                      local_b50.geometryUserPtr = local_ba0->userPtr;
                      local_b50.hit = (RTCHitN *)&local_b80;
                      local_b50.N = 1;
                      local_b50.ray = (RTCRayN *)ray;
                      if ((local_ba0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*local_ba0->occlusionFilterN)(&local_b50), *local_b50.valid != 0)) {
                        if (*(code **)(local_a80._0_8_ + 0x10) != (code *)0x0) {
                          if (((*(byte *)local_a80._0_8_ & 2) != 0) ||
                             (((local_ba0->field_8).field_0x2 & 0x40) != 0)) {
                            (**(code **)(local_a80._0_8_ + 0x10))(&local_b50);
                          }
                          if (*local_b50.valid == 0) goto LAB_002dc93a;
                        }
                        bVar92 = false;
                      }
                      else {
LAB_002dc93a:
                        ray->tfar = fVar112;
                        local_bc0._0_8_ = local_bc0._0_8_ ^ 1L << (local_b98 & 0x3f);
                        bVar92 = true;
                      }
                      uVar101 = local_bc0._0_8_;
                      context = (RayQueryContext *)local_a40._0_8_;
                      puVar103 = (ulong *)local_aa0._0_8_;
                      uVar104 = local_a60._0_8_;
                    }
                    if (!bVar92) {
                      auVar146 = ZEXT1664(local_ab0);
                      auVar148 = ZEXT1664(local_ac0);
                      auVar151 = ZEXT1664(local_ad0);
                      auVar159 = ZEXT1664(local_ae0);
                      auVar168 = ZEXT1664(local_af0);
                      auVar133 = ZEXT1664(local_b00);
                      auVar137 = ZEXT1664(local_b10);
                      auVar143 = ZEXT1664(local_b20);
                      iVar94 = 0;
                      uVar97 = local_be8;
                      uVar101 = local_bd0;
                      uVar102 = local_bd8;
                      uVar107 = local_be0;
                      if (bVar108) {
                        ray->tfar = -INFINITY;
                        iVar94 = 3;
                      }
                      goto LAB_002dc9f2;
                    }
                  } while (uVar101 != 0);
                }
              }
              uVar97 = uVar97 + 1;
              bVar108 = uVar97 < local_b88;
            } while (uVar97 != local_b88);
            auVar146 = ZEXT1664(local_ab0);
            auVar148 = ZEXT1664(local_ac0);
            auVar151 = ZEXT1664(local_ad0);
            auVar159 = ZEXT1664(local_ae0);
            auVar168 = ZEXT1664(local_af0);
            auVar133 = ZEXT1664(local_b00);
            auVar137 = ZEXT1664(local_b10);
            auVar143 = ZEXT1664(local_b20);
            iVar94 = 0;
            uVar97 = local_be8;
            uVar101 = local_bd0;
            uVar102 = local_bd8;
            uVar107 = local_be0;
          }
        }
LAB_002dc9f2:
      } while (iVar94 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }